

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

bool jsonip::parser::semantic_rule<jsonip::grammar::member_name,jsonip::parser::string_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  PositionType pcVar1;
  vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
  *this;
  long lVar2;
  long *plVar3;
  bool bVar4;
  pair<jsonip::holder,_const_jsonip::helper_*> local_60;
  string local_50;
  
  pcVar1 = state->reader_->pos_;
  bVar4 = seq_<jsonip::parser::char_<(char)34>,jsonip::parser::star_<jsonip::parser::or_<jsonip::parser::seq_<jsonip::parser::char_<(char)92>,jsonip::parser::anychar_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::notchar_<(char)34>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>>,jsonip::parser::char_<(char)34>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  if (bVar4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pcVar1 + 1,
               pcVar1 + (long)(state->reader_->pos_ + (-1 - (long)pcVar1)));
    decode_string(&local_50);
    this = (vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
            *)state->ss_;
    lVar2 = *(long *)(this + 8);
    plVar3 = *(long **)(lVar2 + -8);
    (**(code **)(*plVar3 + 0x38))(&local_60,plVar3,lVar2 + -0x10,&local_50);
    std::
    vector<std::pair<jsonip::holder,jsonip::helper_const*>,std::allocator<std::pair<jsonip::holder,jsonip::helper_const*>>>
    ::emplace_back<std::pair<jsonip::holder,jsonip::helper_const*>>(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }